

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateInfo.cpp
# Opt level: O0

bool __thiscall helics::FederateInfo::checkFlagProperty(FederateInfo *this,int propId,bool defVal)

{
  bool bVar1;
  const_iterator __lhs;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  pair<int,_bool> *prop;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *__range1;
  reference in_stack_ffffffffffffffc8;
  __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
  local_28;
  long local_20;
  byte local_15;
  int local_14;
  bool local_1;
  
  local_15 = in_DL & 1;
  local_20 = in_RDI + 0x30;
  local_14 = in_ESI;
  local_28._M_current =
       (pair<int,_bool> *)
       CLI::std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::begin
                 ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                  in_stack_ffffffffffffffc8);
  __lhs = CLI::std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::end
                    ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                     in_stack_ffffffffffffffc8);
  do {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_0034dad9:
      local_1 = (bool)(local_15 & 1);
      return local_1;
    }
    in_stack_ffffffffffffffc8 =
         __gnu_cxx::
         __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
         ::operator*(&local_28);
    if (in_stack_ffffffffffffffc8->first == local_14) {
      local_15 = in_stack_ffffffffffffffc8->second;
      goto LAB_0034dad9;
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

bool FederateInfo::checkFlagProperty(int propId, bool defVal) const
{
    for (const auto& prop : flagProps) {
        if (prop.first == propId) {
            return prop.second;
        }
    }
    return defVal;
}